

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
LineSegmentsRenderer
          (LineSegmentsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,GetterYs<signed_char> *getter1,GetterYRef *getter2,TransformerLinLin *transformer,
          ImU32 col,float weight)

{
  int iVar1;
  float weight_local;
  ImU32 col_local;
  TransformerLinLin *transformer_local;
  GetterYRef *getter2_local;
  GetterYs<signed_char> *getter1_local;
  LineSegmentsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  *this_local;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar1 = ImMin<int>(this->Getter1->Count,this->Getter2->Count);
  this->Prims = iVar1;
  this->Col = col;
  this->Weight = weight;
  return;
}

Assistant:

inline LineSegmentsRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col, float weight) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count)),
        Col(col),
        Weight(weight)
    {}